

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O3

void __thiscall testbench::memory::add_RAM(memory *this,uint start_address,uint size)

{
  address_range *__p;
  shared_ptr<testbench::address_range> RAM;
  allocator_type local_49;
  __shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2> local_48;
  value_type local_38;
  
  local_48 = (__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
  __p = (address_range *)operator_new(0x28);
  __p->_vptr_address_range = (_func_int **)&PTR_is_writable_0010b9c8;
  *(uint *)&__p[1]._vptr_address_range = start_address;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(__p + 2),(ulong)size,
             &local_49);
  std::__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>::
  reset<testbench::address_range>(&local_48,__p);
  local_38.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48._M_ptr;
  local_38.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_48._M_refcount._M_pi;
  local_48 = (__shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>)
             (ZEXT816(0) << 0x20);
  std::
  vector<std::shared_ptr<testbench::address_range>,_std::allocator<std::shared_ptr<testbench::address_range>_>_>
  ::push_back(&this->ranges,&local_38);
  if (local_38.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<testbench::address_range,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_refcount._M_pi);
  }
  return;
}

Assistant:

void memory::add_RAM(unsigned start_address, unsigned size)
{
    std::shared_ptr<address_range> RAM;
    
    RAM.reset((address_range*)(new general_RAM(start_address, size)));
    add_range(std::move(RAM));
}